

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglCreateContextExtTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::egl::anon_unknown_3::CreateContextExtCase::iterate(CreateContextExtCase *this)

{
  ostringstream *poVar1;
  pointer ppvVar2;
  pointer ppvVar3;
  EGLConfig config;
  EGLDisplay pvVar4;
  TestLog *log;
  NativeDisplay *pNVar5;
  bool bVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  CreateContextExtCase *pCVar8;
  uint uVar9;
  EGLint EVar10;
  Visibility VVar11;
  int iVar12;
  deUint32 err;
  size_t sVar13;
  ostream *poVar14;
  eglu *this_00;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var15;
  _Rb_tree_node_base *p_Var16;
  Library *egl;
  NativePixmapFactory *pNVar17;
  NativeWindow *window;
  EGLSurface pvVar18;
  long *plVar19;
  NativeWindowFactory *pNVar20;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  NotSupportedError *this_01;
  TestError *this_02;
  qpTestLog *pqVar21;
  FILE *pFVar22;
  char **ppcVar23;
  EGLint mask;
  EGLint flags;
  IterateResult IVar24;
  char *pcVar25;
  int *piVar26;
  qpTestResult testResult;
  TestContext *this_03;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extensions;
  ScopedLogSection section;
  UniqueSurface surface;
  ostringstream attribListString;
  allocator<char> local_3f9;
  qpTestLog *local_3f8;
  long local_3f0;
  undefined1 local_3e8 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3d0;
  pointer local_3c8;
  char *pcStack_3c0;
  CreateContextExtCase *local_3b8;
  ScopedLogSection local_3b0;
  char **local_3a8;
  char *local_3a0;
  char *local_398;
  char *pcStack_390;
  undefined1 local_388 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_378 [6];
  ios_base local_318 [8];
  ios_base local_310 [264];
  long *local_208 [2];
  long local_1f8 [2];
  string local_1e8;
  long *local_1c8 [2];
  long local_1b8 [2];
  undefined1 local_1a8 [32];
  _Rb_tree_node_base *local_188;
  size_t local_180;
  ios_base local_138 [264];
  
  if (this->m_iteration == 0) {
    piVar26 = (this->m_attribList).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_3b8 = this;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    do {
      iVar12 = *piVar26;
      do {
        while( true ) {
          while (iVar12 < 0x30fb) {
            if (iVar12 == 0x3038) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"EGL_NONE",8);
              pCVar8 = local_3b8;
              local_388._0_8_ =
                   ((local_3b8->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
              poVar1 = (ostringstream *)(local_388 + 8);
              std::__cxx11::ostringstream::ostringstream(poVar1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar1,"EGL attrib list: { ",0x13);
              std::__cxx11::stringbuf::str();
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar1,(char *)local_3e8._16_8_,(long)local_3d0);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," }",2);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_388,(EndMessageToken *)&tcu::TestLog::EndMessage);
              if ((FILE *)local_3e8._16_8_ != (FILE *)&local_3c8) {
                operator_delete((void *)local_3e8._16_8_,(long)local_3c8 + 1);
              }
              std::__cxx11::ostringstream::~ostringstream(poVar1);
              std::ios_base::~ios_base(local_310);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
              std::ios_base::~ios_base(local_138);
              local_1a8._8_4_ = _S_red;
              local_1a8._16_8_ = (_Base_ptr)0x0;
              p_Var16 = (_Rb_tree_node_base *)(local_1a8 + 8);
              local_180 = 0;
              local_1a8._24_8_ = p_Var16;
              local_188 = p_Var16;
              this_00 = (eglu *)EglTestContext::getLibrary((pCVar8->super_TestCase).m_eglTestCtx);
              eglu::getDisplayExtensions_abi_cxx11_
                        ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)(local_3e8 + 0x10),this_00,(Library *)pCVar8->m_display,p_Var16);
              piVar26 = (pCVar8->m_attribList).super__Vector_base<int,_std::allocator<int>_>._M_impl
                        .super__Vector_impl_data._M_start;
              goto LAB_001feb13;
            }
            if (iVar12 == 0x3098) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,
                         "EGL_CONTEXT_MAJOR_VERSION_KHR(EGL_CONTEXT_CLIENT_VERSION), ",0x3b);
              poVar14 = (ostream *)std::ostream::operator<<((ostringstream *)local_1a8,piVar26[1]);
              std::__ostream_insert<char,std::char_traits<char>>(poVar14,", ",2);
              goto LAB_001fe9b2;
            }
            if (iVar12 == 0x30bf) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"EGL_CONTEXT_OPENGL_ROBUST_ACCESS_EXT, ",0x26);
              uVar9 = piVar26[1];
              if (uVar9 < 2) {
                pcVar25 = "status == EGL_TRUE";
                if (uVar9 == 0) {
                  pcVar25 = "status == EGL_FALSE";
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,pcVar25 + 10,(ulong)(uVar9 == 0) | 8);
              }
              else {
                std::ostream::operator<<((ostringstream *)local_1a8,uVar9);
              }
              goto LAB_001fe9b2;
            }
          }
          if (0x30fc < iVar12) break;
          if (iVar12 == 0x30fb) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"EGL_CONTEXT_MINOR_VERSION_KHR, ",0x1f);
            poVar14 = (ostream *)std::ostream::operator<<((ostringstream *)local_1a8,piVar26[1]);
            std::__ostream_insert<char,std::char_traits<char>>(poVar14,", ",2);
            goto LAB_001fe9b2;
          }
          if (iVar12 == 0x30fc) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"EGL_CONTEXT_FLAGS_KHR, ",0x17);
            (anonymous_namespace)::eglContextFlagsToString_abi_cxx11_
                      ((string *)local_388,(_anonymous_namespace_ *)(ulong)(uint)piVar26[1],flags);
            poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1a8,(char *)local_388._0_8_,local_388._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar14,", ",2);
LAB_001fe95d:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_388._0_8_ != local_378) {
              operator_delete((void *)local_388._0_8_,
                              (ulong)(local_378[0]._M_allocated_capacity + 1));
            }
            goto LAB_001fe9b2;
          }
        }
        if (iVar12 == 0x30fd) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"EGL_CONTEXT_OPENGL_PROFILE_MASK_KHR, ",0x25);
          (anonymous_namespace)::eglProfileMaskToString_abi_cxx11_
                    ((string *)local_388,(_anonymous_namespace_ *)(ulong)(uint)piVar26[1],mask);
          poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,(char *)local_388._0_8_,local_388._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,", ",2);
          goto LAB_001fe95d;
        }
      } while (iVar12 != 0x31bd);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"EGL_CONTEXT_OPENGL_RESET_NOTIFICATION_STRATEGY_KHR, ",0x34);
      pcVar25 = "<Unknown>";
      if (piVar26[1] == 0x31bf) {
        pcVar25 = "EGL_LOSE_CONTEXT_ON_RESET_KHR";
      }
      if (piVar26[1] == 0x31be) {
        pcVar25 = "EGL_NO_RESET_NOTIFICATION_KHR";
      }
      sVar13 = strlen(pcVar25);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar25,sVar13);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
LAB_001fe9b2:
      piVar26 = piVar26 + 2;
    } while( true );
  }
LAB_001fef1d:
  ppvVar2 = (this->m_configs).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  ppvVar3 = (this->m_configs).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (this->m_iteration < (int)((ulong)((long)ppvVar2 - (long)ppvVar3) >> 3)) {
    egl = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
    config = (this->m_configs).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
             super__Vector_impl_data._M_start[this->m_iteration];
    uVar9 = eglu::getConfigAttribInt(egl,this->m_display,config,0x3033);
    EVar10 = eglu::getConfigAttribInt(egl,this->m_display,config,0x3028);
    if ((uVar9 & 1) == 0) {
      if ((uVar9 & 4) == 0) {
        if ((uVar9 & 2) == 0) {
          this_02 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (this_02,"Invalid or empty surface type bits",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglCreateContextExtTests.cpp"
                     ,0x39e);
          __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
        pNVar17 = eglu::selectNativePixmapFactory
                            (((this->super_TestCase).m_eglTestCtx)->m_nativeDisplayFactory,
                             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->
                             m_cmdLine);
        window = (NativeWindow *)
                 (**(code **)(*(long *)pNVar17 + 0x20))
                           (pNVar17,(((this->super_TestCase).m_eglTestCtx)->m_nativeDisplay).
                                    super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>
                                    .m_data.ptr,this->m_display,config,0,0x100,0x100);
        pvVar4 = this->m_display;
        pvVar18 = eglu::createPixmapSurface
                            ((((this->super_TestCase).m_eglTestCtx)->m_nativeDisplay).
                             super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>
                             .m_data.ptr,(NativePixmap *)window,pvVar4,config,(EGLAttrib *)0x0);
        eglu::UniqueSurface::UniqueSurface((UniqueSurface *)local_388,egl,pvVar4,pvVar18);
        executeForSurface(this,config,(EGLSurface)local_378[0]._0_8_);
      }
      else {
        pNVar20 = eglu::selectNativeWindowFactory
                            (((this->super_TestCase).m_eglTestCtx)->m_nativeDisplayFactory,
                             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->
                             m_cmdLine);
        pvVar4 = this->m_display;
        pNVar5 = (((this->super_TestCase).m_eglTestCtx)->m_nativeDisplay).
                 super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>.
                 m_data.ptr;
        VVar11 = eglu::parseWindowVisibility
                           (((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->
                            m_cmdLine);
        local_388._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x10000000100;
        local_388._8_4_ = VVar11;
        iVar12 = (*(pNVar20->super_FactoryBase).super_AbstractFactory._vptr_AbstractFactory[4])
                           (pNVar20,pNVar5,pvVar4,config);
        window = (NativeWindow *)CONCAT44(extraout_var,iVar12);
        pvVar4 = this->m_display;
        pvVar18 = eglu::createWindowSurface
                            ((((this->super_TestCase).m_eglTestCtx)->m_nativeDisplay).
                             super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>
                             .m_data.ptr,window,pvVar4,config,(EGLAttrib *)0x0);
        eglu::UniqueSurface::UniqueSurface((UniqueSurface *)local_388,egl,pvVar4,pvVar18);
        executeForSurface(this,config,(EGLSurface)local_378[0]._0_8_);
      }
      eglu::UniqueSurface::~UniqueSurface((UniqueSurface *)local_388);
      (*window->_vptr_NativeWindow[1])(window);
    }
    else {
      log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_388);
      std::ostream::operator<<((ostringstream *)local_388,EVar10);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_388);
      std::ios_base::~ios_base(local_318);
      plVar19 = (long *)std::__cxx11::string::replace((ulong)local_1c8,0,(char *)0x0,0x351a84);
      local_3f8 = (qpTestLog *)local_3e8;
      pqVar21 = (qpTestLog *)(plVar19 + 2);
      if ((qpTestLog *)*plVar19 == pqVar21) {
        local_3e8._0_8_ = *(undefined8 *)pqVar21;
        local_3e8._8_8_ = plVar19[3];
      }
      else {
        local_3e8._0_8_ = *(undefined8 *)pqVar21;
        local_3f8 = (qpTestLog *)*plVar19;
      }
      local_3f0 = plVar19[1];
      *plVar19 = (long)pqVar21;
      plVar19[1] = 0;
      *(undefined1 *)(plVar19 + 2) = 0;
      plVar19 = (long *)std::__cxx11::string::append((char *)&local_3f8);
      pFVar22 = (FILE *)(plVar19 + 2);
      if ((FILE *)*plVar19 == pFVar22) {
        local_3c8 = *(pointer *)&pFVar22->_flags;
        pcStack_3c0 = (char *)plVar19[3];
        local_3e8._16_8_ = (FILE *)&local_3c8;
      }
      else {
        local_3c8 = *(pointer *)&pFVar22->_flags;
        local_3e8._16_8_ = (FILE *)*plVar19;
      }
      local_3d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)plVar19[1];
      *plVar19 = (long)pFVar22;
      plVar19[1] = 0;
      *(undefined1 *)(plVar19 + 2) = 0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1a8,(char *)local_3e8._16_8_,&local_3f9);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_388);
      std::ostream::operator<<(local_388,EVar10);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_388);
      std::ios_base::~ios_base(local_318);
      plVar19 = (long *)std::__cxx11::string::replace((ulong)local_208,0,(char *)0x0,0x351a84);
      ppcVar23 = (char **)(plVar19 + 2);
      if ((char **)*plVar19 == ppcVar23) {
        local_398 = *ppcVar23;
        pcStack_390 = (char *)plVar19[3];
        local_3a8 = &local_398;
      }
      else {
        local_398 = *ppcVar23;
        local_3a8 = (char **)*plVar19;
      }
      local_3a0 = (char *)plVar19[1];
      *plVar19 = (long)ppcVar23;
      plVar19[1] = 0;
      *(undefined1 *)(plVar19 + 2) = 0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1e8,(char *)local_3a8,(allocator<char> *)local_388);
      tcu::ScopedLogSection::ScopedLogSection(&local_3b0,log,(string *)local_1a8,&local_1e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
      }
      if (local_3a8 != &local_398) {
        operator_delete(local_3a8,(ulong)(local_398 + 1));
      }
      if (local_208[0] != local_1f8) {
        operator_delete(local_208[0],local_1f8[0] + 1);
      }
      if ((undefined1 *)CONCAT44(local_1a8._4_4_,local_1a8._0_4_) != local_1a8 + 0x10) {
        operator_delete((undefined1 *)CONCAT44(local_1a8._4_4_,local_1a8._0_4_),
                        (ulong)(local_1a8._16_8_ + 1));
      }
      if ((FILE *)local_3e8._16_8_ != (FILE *)&local_3c8) {
        operator_delete((void *)local_3e8._16_8_,(ulong)((long)&(local_3c8->_M_dataplus)._M_p + 1));
      }
      if (local_3f8 != (qpTestLog *)local_3e8) {
        operator_delete(local_3f8,local_3e8._0_8_ + 1);
      }
      if (local_1c8[0] != local_1b8) {
        operator_delete(local_1c8[0],local_1b8[0] + 1);
      }
      local_1a8._0_4_ = 0x3057;
      local_1a8._4_4_ = 0x40;
      local_1a8._8_4_ = 0x3056;
      local_1a8._12_4_ = 0x40;
      local_1a8._16_4_ = 0x3038;
      pvVar4 = this->m_display;
      iVar12 = (*egl->_vptr_Library[10])(egl,pvVar4,config);
      eglu::UniqueSurface::UniqueSurface
                ((UniqueSurface *)local_388,egl,pvVar4,(EGLSurface)CONCAT44(extraout_var_00,iVar12))
      ;
      err = (*egl->_vptr_Library[0x1f])(egl);
      eglu::checkError(err,"eglCreatePbufferSurface",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglCreateContextExtTests.cpp"
                       ,0x387);
      executeForSurface(this,config,(EGLSurface)local_378[0]._0_8_);
      eglu::UniqueSurface::~UniqueSurface((UniqueSurface *)local_388);
      tcu::TestLog::endSection(local_3b0.m_log);
    }
    this->m_iteration = this->m_iteration + 1;
    IVar24 = CONTINUE;
  }
  else {
    if (ppvVar2 == ppvVar3) {
      local_388._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar1 = (ostringstream *)(local_388 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"No supported configs found",0x1a);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_388,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_310);
      this_03 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
      pcVar25 = "No supported configs found";
      testResult = QP_TEST_RESULT_NOT_SUPPORTED;
    }
    else {
      this_03 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
      if (this->m_isOk == true) {
        tcu::TestContext::setTestResult(this_03,QP_TEST_RESULT_PASS,"Pass");
        return STOP;
      }
      pcVar25 = "Fail";
      testResult = QP_TEST_RESULT_FAIL;
    }
    tcu::TestContext::setTestResult(this_03,testResult,pcVar25);
    IVar24 = STOP;
  }
  return IVar24;
LAB_001feb13:
  iVar12 = *piVar26;
  if (iVar12 < 0x30fc) {
    if (iVar12 < 0x30bf) {
      if (iVar12 == 0x3098) goto LAB_001fee08;
      if (iVar12 == 0x3038) goto LAB_001fee11;
      goto LAB_001feb13;
    }
    if (iVar12 == 0x30bf) {
      local_3f8 = (qpTestLog *)0x21;
      local_388._0_8_ = local_378;
      local_388._0_8_ = std::__cxx11::string::_M_create((ulong *)local_388,(ulong)&local_3f8);
      local_378[0]._M_allocated_capacity = local_3f8;
      *(undefined8 *)(local_388._0_8_ + 0x10) = 0x725f747865746e6f;
      *(undefined8 *)(local_388._0_8_ + 0x18) = 0x73656e747375626f;
      *(undefined8 *)local_388._0_8_ = 0x5f5458455f4c4745;
      *(undefined8 *)(local_388._0_8_ + 8) = 0x635f657461657263;
      *(char *)(local_388._0_8_ + 0x20) = 's';
      local_388._8_8_ = local_3f8;
      *(char *)((long)&local_3f8->flags + local_388._0_8_) = '\0';
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)local_1a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_388);
      goto LAB_001fedeb;
    }
    if (iVar12 != 0x30fb) goto LAB_001feb13;
    local_3f8 = (qpTestLog *)&DAT_00000016;
    local_388._0_8_ = local_378;
    local_388._0_8_ = std::__cxx11::string::_M_create((ulong *)local_388,(ulong)&local_3f8);
    local_378[0]._M_allocated_capacity = local_3f8;
    *(undefined8 *)local_388._0_8_ = 0x5f52484b5f4c4745;
    *(undefined8 *)(local_388._0_8_ + 8) = 0x635f657461657263;
    builtin_strncpy((char *)((long)(local_388._0_8_ + 8) + 6),"_context",8);
    local_388._8_8_ = local_3f8;
    *(char *)((long)&local_3f8->flags + local_388._0_8_) = '\0';
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)local_1a8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_388);
  }
  else if (iVar12 < 0x3138) {
    if (iVar12 == 0x30fc) {
      local_3f8 = (qpTestLog *)&DAT_00000016;
      local_388._0_8_ = local_378;
      local_388._0_8_ = std::__cxx11::string::_M_create((ulong *)local_388,(ulong)&local_3f8);
      local_378[0]._M_allocated_capacity = local_3f8;
      *(undefined8 *)local_388._0_8_ = 0x5f52484b5f4c4745;
      *(undefined8 *)(local_388._0_8_ + 8) = 0x635f657461657263;
      builtin_strncpy((char *)((long)(local_388._0_8_ + 8) + 6),"_context",8);
      local_388._8_8_ = local_3f8;
      *(char *)((long)&local_3f8->flags + local_388._0_8_) = '\0';
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)local_1a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_388);
    }
    else {
      if (iVar12 != 0x30fd) goto LAB_001feb13;
      local_3f8 = (qpTestLog *)&DAT_00000016;
      local_388._0_8_ = local_378;
      local_388._0_8_ = std::__cxx11::string::_M_create((ulong *)local_388,(ulong)&local_3f8);
      local_378[0]._M_allocated_capacity = local_3f8;
      *(undefined8 *)local_388._0_8_ = 0x5f52484b5f4c4745;
      *(undefined8 *)(local_388._0_8_ + 8) = 0x635f657461657263;
      builtin_strncpy((char *)((long)(local_388._0_8_ + 8) + 6),"_context",8);
      local_388._8_8_ = local_3f8;
      *(char *)((long)&local_3f8->flags + local_388._0_8_) = '\0';
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)local_1a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_388);
    }
  }
  else if (iVar12 == 0x3138) {
    local_3f8 = (qpTestLog *)0x21;
    local_388._0_8_ = local_378;
    local_388._0_8_ = std::__cxx11::string::_M_create((ulong *)local_388,(ulong)&local_3f8);
    local_378[0]._M_allocated_capacity = local_3f8;
    *(undefined8 *)(local_388._0_8_ + 0x10) = 0x725f747865746e6f;
    *(undefined8 *)(local_388._0_8_ + 0x18) = 0x73656e747375626f;
    *(undefined8 *)local_388._0_8_ = 0x5f5458455f4c4745;
    *(undefined8 *)(local_388._0_8_ + 8) = 0x635f657461657263;
    *(char *)(local_388._0_8_ + 0x20) = 's';
    local_388._8_8_ = local_3f8;
    *(char *)((long)&local_3f8->flags + local_388._0_8_) = '\0';
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)local_1a8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_388);
  }
  else {
    if (iVar12 != 0x31bd) goto LAB_001feb13;
    local_3f8 = (qpTestLog *)&DAT_00000016;
    local_388._0_8_ = local_378;
    local_388._0_8_ = std::__cxx11::string::_M_create((ulong *)local_388,(ulong)&local_3f8);
    local_378[0]._M_allocated_capacity = local_3f8;
    *(undefined8 *)local_388._0_8_ = 0x5f52484b5f4c4745;
    *(undefined8 *)(local_388._0_8_ + 8) = 0x635f657461657263;
    builtin_strncpy((char *)((long)(local_388._0_8_ + 8) + 6),"_context",8);
    local_388._8_8_ = local_3f8;
    *(char *)((long)&local_3f8->flags + local_388._0_8_) = '\0';
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)local_1a8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_388);
  }
LAB_001fedeb:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._0_8_ != local_378) {
    operator_delete((void *)local_388._0_8_,(ulong)(local_378[0]._M_allocated_capacity + 1));
  }
LAB_001fee08:
  piVar26 = piVar26 + 2;
  goto LAB_001feb13;
LAB_001fee11:
  if ((_Rb_tree_node_base *)local_1a8._24_8_ != (_Rb_tree_node_base *)(local_1a8 + 8)) {
    poVar1 = (ostringstream *)(local_388 + 8);
    bVar6 = true;
    p_Var16 = (_Rb_tree_node_base *)local_1a8._24_8_;
    do {
      pbVar7 = local_3d0;
      _Var15 = std::
               __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                         (local_3e8._16_8_,local_3d0,p_Var16 + 1);
      if (_Var15._M_current == pbVar7) {
        local_388._0_8_ =
             ((local_3b8->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"Required extension \'",0x14);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,*(char **)(p_Var16 + 1),(long)p_Var16[1]._M_parent);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\' not supported",0xf)
        ;
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_388,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_310);
        bVar6 = false;
      }
      p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var16);
    } while (p_Var16 != (_Rb_tree_node_base *)(local_1a8 + 8));
    if (!bVar6) {
      this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_01,"Required extensions not supported",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglCreateContextExtTests.cpp"
                 ,0x1b6);
      __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_3e8 + 0x10));
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1a8);
  this = local_3b8;
  goto LAB_001fef1d;
}

Assistant:

TestCase::IterateResult CreateContextExtCase::iterate (void)
{
	if (m_iteration == 0)
	{
		logAttribList();
		checkRequiredExtensions();
	}

	if (m_iteration < (int)m_configs.size())
	{
		const Library&		egl				= m_eglTestCtx.getLibrary();
		const EGLConfig		config			= m_configs[m_iteration];
		const EGLint		surfaceTypes	= eglu::getConfigAttribInt(egl, m_display, config, EGL_SURFACE_TYPE);
		const EGLint		configId		= eglu::getConfigAttribInt(egl, m_display, config, EGL_CONFIG_ID);

		if ((surfaceTypes & EGL_PBUFFER_BIT) != 0)
		{
			tcu::ScopedLogSection	section			(m_testCtx.getLog(), ("EGLConfig ID: " + de::toString(configId) + " with PBuffer").c_str(), ("EGLConfig ID: " + de::toString(configId)).c_str());
			const EGLint			attribList[]	=
			{
				EGL_WIDTH,	64,
				EGL_HEIGHT,	64,
				EGL_NONE
			};
			eglu::UniqueSurface		surface			(egl, m_display, egl.createPbufferSurface(m_display, config, attribList));
			EGLU_CHECK_MSG(egl, "eglCreatePbufferSurface");

			executeForSurface(config, *surface);
		}
		else if ((surfaceTypes & EGL_WINDOW_BIT) != 0)
		{
			const eglu::NativeWindowFactory&	factory	= eglu::selectNativeWindowFactory(m_eglTestCtx.getNativeDisplayFactory(), m_testCtx.getCommandLine());

			de::UniquePtr<eglu::NativeWindow>	window	(factory.createWindow(&m_eglTestCtx.getNativeDisplay(), m_display, config, DE_NULL, eglu::WindowParams(256, 256, eglu::parseWindowVisibility(m_testCtx.getCommandLine()))));
			eglu::UniqueSurface					surface	(egl, m_display, eglu::createWindowSurface(m_eglTestCtx.getNativeDisplay(), *window, m_display, config, DE_NULL));

			executeForSurface(config, *surface);
		}
		else if ((surfaceTypes & EGL_PIXMAP_BIT) != 0)
		{
			const eglu::NativePixmapFactory&	factory	= eglu::selectNativePixmapFactory(m_eglTestCtx.getNativeDisplayFactory(), m_testCtx.getCommandLine());

			de::UniquePtr<eglu::NativePixmap>	pixmap	(factory.createPixmap(&m_eglTestCtx.getNativeDisplay(), m_display, config, DE_NULL, 256, 256));
			eglu::UniqueSurface					surface	(egl, m_display, eglu::createPixmapSurface(m_eglTestCtx.getNativeDisplay(), *pixmap, m_display, config, DE_NULL));

			executeForSurface(config, *surface);
		}
		else // No supported surface type
			TCU_FAIL("Invalid or empty surface type bits");

		m_iteration++;
		return CONTINUE;
	}
	else
	{
		if (m_configs.size() == 0)
		{
			m_testCtx.getLog() << TestLog::Message << "No supported configs found" << TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "No supported configs found");
		}
		else if (m_isOk)
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");

		return STOP;
	}
}